

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_load
               (NegativeTestContext *ctx,TextureType imageType)

{
  int local_cc;
  int local_c8;
  int fmtNdx;
  int memoryNdx;
  allocator<char> local_b1;
  string local_b0;
  undefined8 local_90;
  MemoryQualifier memoryOptions [2];
  TextureFormat formats [13];
  TextureType imageType_local;
  NegativeTestContext *ctx_local;
  
  tcu::TextureFormat::TextureFormat((TextureFormat *)memoryOptions,RGBA,FLOAT);
  tcu::TextureFormat::TextureFormat(formats,RGBA,HALF_FLOAT);
  tcu::TextureFormat::TextureFormat(formats + 1,R,FLOAT);
  tcu::TextureFormat::TextureFormat(formats + 2,RGBA,UNORM_INT8);
  tcu::TextureFormat::TextureFormat(formats + 3,RGBA,SNORM_INT8);
  tcu::TextureFormat::TextureFormat(formats + 4,RGBA,SIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats + 5,RGBA,SIGNED_INT16);
  tcu::TextureFormat::TextureFormat(formats + 6,RGBA,SIGNED_INT8);
  tcu::TextureFormat::TextureFormat(formats + 7,R,SIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats + 8,RGBA,UNSIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats + 9,RGBA,UNSIGNED_INT16);
  tcu::TextureFormat::TextureFormat(formats + 10,RGBA,UNSIGNED_INT8);
  tcu::TextureFormat::TextureFormat(formats + 0xb,R,UNSIGNED_INT32);
  local_90 = 0x300000002;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"It is an error to pass a writeonly image to imageLoad.",&local_b1)
  ;
  NegativeTestContext::beginSection(ctx,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
    for (local_cc = 0; local_cc < 0xd; local_cc = local_cc + 1) {
      testShader(ctx,IMAGE_OPERATION_LOAD,memoryOptions[(long)local_c8 + -2],imageType,
                 formats + (long)local_cc + -1);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_load (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::HALF_FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SNORM_INT8),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	ctx.beginSection("It is an error to pass a writeonly image to imageLoad.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			testShader(ctx, IMAGE_OPERATION_LOAD, memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
		}
	}
	ctx.endSection();
}